

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen15Private.cpp
# Opt level: O0

bool __thiscall
COLLADASaxFWL15::ColladaParserAutoGen15Private::
_preBegin__profile_GLES__technique__pass__states__light_spot_cutoff
          (ColladaParserAutoGen15Private *this,ParserAttributes *attributes,void **attributeDataPtr,
          void **validationDataPtr)

{
  bool bVar1;
  ParserTemplateBase *this_00;
  IErrorHandler *pIVar2;
  long *in_RSI;
  ParserChar *in_RDI;
  float fVar3;
  bool failed_1;
  bool failed;
  ParserChar *attributeValue;
  StringHash hash;
  ParserChar *attribute;
  ParserChar **attributeArray;
  profile_GLES__technique__pass__states__light_spot_cutoff__AttributeData *attributeData;
  ParserChar *in_stack_00000088;
  ParserChar *in_stack_00000090;
  StringHash in_stack_00000098;
  ErrorType in_stack_000000a0;
  Severity in_stack_000000a4;
  ParserTemplateBase *in_stack_000000a8;
  undefined6 in_stack_ffffffffffffffa8;
  byte in_stack_ffffffffffffffae;
  byte in_stack_ffffffffffffffaf;
  ParserTemplateBase *in_stack_ffffffffffffffb0;
  StringHash in_stack_ffffffffffffffb8;
  StringHash in_stack_ffffffffffffffc0;
  ParserChar *text;
  undefined8 *puVar4;
  bool local_1;
  
  this_00 = (ParserTemplateBase *)
            GeneratedSaxParser::ParserTemplateBase::
            newData<COLLADASaxFWL15::profile_GLES__technique__pass__states__light_spot_cutoff__AttributeData>
                      (in_stack_ffffffffffffffb0,
                       (void **)CONCAT17(in_stack_ffffffffffffffaf,
                                         CONCAT16(in_stack_ffffffffffffffae,
                                                  in_stack_ffffffffffffffa8)));
  puVar4 = (undefined8 *)*in_RSI;
  if (puVar4 == (undefined8 *)0x0) {
LAB_009f3afe:
    if ((((ulong)(this_00->super_Parser)._vptr_Parser & 1) == 0) &&
       (bVar1 = GeneratedSaxParser::ParserTemplateBase::handleError
                          (this_00,(Severity)((ulong)puVar4 >> 0x20),(ErrorType)puVar4,
                           in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                           (ParserChar *)in_stack_ffffffffffffffb0), bVar1)) {
      local_1 = false;
    }
    else {
      local_1 = true;
    }
  }
  else {
    do {
      while( true ) {
        while( true ) {
          while( true ) {
            text = (ParserChar *)*puVar4;
            if (text == (ParserChar *)0x0) {
              in_stack_ffffffffffffffc0 = 0;
              goto LAB_009f3afe;
            }
            in_stack_ffffffffffffffb8 = GeneratedSaxParser::Utils::calculateStringHash(text);
            if (puVar4 + 1 == (undefined8 *)0x0) {
              return false;
            }
            in_stack_ffffffffffffffb0 = (ParserTemplateBase *)puVar4[1];
            puVar4 = puVar4 + 2;
            if (in_stack_ffffffffffffffb8 != 0x704ac8) break;
            pIVar2 = (IErrorHandler *)
                     GeneratedSaxParser::Utils::toUint64(in_RDI,(bool *)(__DT_RELA + 0x169b5));
            (this_00->super_Parser).mErrorHandler = pIVar2;
            if (((in_stack_ffffffffffffffae & 1) != 0) &&
               (bVar1 = GeneratedSaxParser::ParserTemplateBase::handleError
                                  (this_00,(Severity)((ulong)puVar4 >> 0x20),(ErrorType)puVar4,
                                   (StringHash)text,in_stack_ffffffffffffffb8,
                                   (ParserChar *)in_stack_ffffffffffffffb0), bVar1)) {
              return false;
            }
            if ((in_stack_ffffffffffffffae & 1) == 0) {
              *(uint *)&(this_00->super_Parser)._vptr_Parser =
                   *(uint *)&(this_00->super_Parser)._vptr_Parser | 1;
            }
          }
          if (in_stack_ffffffffffffffb8 != 0x76887d) break;
          (this_00->super_Parser).mSaxParser = (SaxParser *)in_stack_ffffffffffffffb0;
        }
        if (in_stack_ffffffffffffffb8 != 0x7c83b5) break;
        fVar3 = GeneratedSaxParser::Utils::toFloat(in_RDI,(bool *)0x7c83b5);
        *(float *)((long)&(this_00->super_Parser)._vptr_Parser + 4) = fVar3;
        if (((in_stack_ffffffffffffffaf & 1) != 0) &&
           (bVar1 = GeneratedSaxParser::ParserTemplateBase::handleError
                              (this_00,(Severity)((ulong)puVar4 >> 0x20),(ErrorType)puVar4,
                               (StringHash)text,in_stack_ffffffffffffffb8,
                               (ParserChar *)in_stack_ffffffffffffffb0), bVar1)) {
          return false;
        }
      }
      bVar1 = GeneratedSaxParser::ParserTemplateBase::handleError
                        (in_stack_000000a8,in_stack_000000a4,in_stack_000000a0,in_stack_00000098,
                         in_stack_00000090,in_stack_00000088);
    } while (!bVar1);
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ColladaParserAutoGen15Private::_preBegin__profile_GLES__technique__pass__states__light_spot_cutoff( const ParserAttributes& attributes, void ** attributeDataPtr, void ** validationDataPtr )
{
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {

        bool validationResult = _validateBegin__profile_GLES__technique__pass__states__light_spot_cutoff( attributes, attributeDataPtr, validationDataPtr );
        if ( !validationResult ) return false;

    } // validation
#endif

profile_GLES__technique__pass__states__light_spot_cutoff__AttributeData* attributeData = newData<profile_GLES__technique__pass__states__light_spot_cutoff__AttributeData>(attributeDataPtr);

const ParserChar** attributeArray = attributes.attributes;
if ( attributeArray )
{
    while (true)
    {
        const ParserChar * attribute = *attributeArray;
        if ( !attribute )
            break;
        StringHash hash = GeneratedSaxParser::Utils::calculateStringHash(attribute);
        attributeArray++;
        if ( !attributeArray )
            return false;
        const ParserChar* attributeValue = *attributeArray;
        attributeArray++;


    switch ( hash )
    {
    case HASH_ATTRIBUTE_VALUE:
    {
bool failed;
attributeData->value = GeneratedSaxParser::Utils::toFloat(attributeValue, failed);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_LIGHT_SPOT_CUTOFF,
        HASH_ATTRIBUTE_VALUE,
        attributeValue))
{
    return false;
}

    break;
    }
    case HASH_ATTRIBUTE_PARAM:
    {

attributeData->param = attributeValue;
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {
    ParserError::ErrorType simpleTypeValidationResult = validate__NCName(attributeData->param, strlen(attributeData->param));
    if (simpleTypeValidationResult != ParserError::SIMPLE_TYPE_VALIDATION_OK)
    {
        if( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
            simpleTypeValidationResult,
            HASH_ELEMENT_LIGHT_SPOT_CUTOFF,
            HASH_ATTRIBUTE_PARAM,
            attributeValue) )
        {
            return false;
        }
    }
    } // validation
#endif

    break;
    }
    case HASH_ATTRIBUTE_INDEX:
    {
bool failed;
attributeData->index = GeneratedSaxParser::Utils::toUint64(attributeValue, failed);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_LIGHT_SPOT_CUTOFF,
        HASH_ATTRIBUTE_INDEX,
        attributeValue))
{
    return false;
}
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {
    ParserError::ErrorType simpleTypeValidationResult = validate__gles_max_lights_index_type(attributeData->index);
    if (simpleTypeValidationResult != ParserError::SIMPLE_TYPE_VALIDATION_OK)
    {
        if( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
            simpleTypeValidationResult,
            HASH_ELEMENT_LIGHT_SPOT_CUTOFF,
            HASH_ATTRIBUTE_INDEX,
            attributeValue) )
        {
            return false;
        }
    }
    } // validation
#endif
if ( !failed )
    attributeData->present_attributes |= profile_GLES__technique__pass__states__light_spot_cutoff__AttributeData::ATTRIBUTE_INDEX_PRESENT;

    break;
    }
    default:
    {
        if ( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL, ParserError::ERROR_UNKNOWN_ATTRIBUTE, HASH_ELEMENT_LIGHT_SPOT_CUTOFF, attribute, attributeValue))
            {return false;}
    }
    }
    }
}
if ( (attributeData->present_attributes & profile_GLES__technique__pass__states__light_spot_cutoff__AttributeData::ATTRIBUTE_INDEX_PRESENT) == 0 )
{
    if ( handleError ( ParserError::SEVERITY_ERROR_NONCRITICAL, ParserError::ERROR_REQUIRED_ATTRIBUTE_MISSING, HASH_ELEMENT_LIGHT_SPOT_CUTOFF, HASH_ATTRIBUTE_INDEX, 0 ) )
        return false;
}


    return true;
}